

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5StructurePromoteTo(Fts5Index *p,int iPromote,int szPromote,Fts5Structure *pStruct)

{
  Fts5StructureSegment *pFVar1;
  int iVar2;
  Fts5StructureLevel *pFVar3;
  Fts5StructureLevel *pFVar4;
  Fts5StructureSegment *pFVar5;
  int sz;
  Fts5StructureLevel *pLvl;
  Fts5StructureLevel *pOut;
  int is;
  int il;
  Fts5Structure *pStruct_local;
  int szPromote_local;
  int iPromote_local;
  Fts5Index *p_local;
  
  pFVar3 = pStruct->aLevel + iPromote;
  if (pFVar3->nMerge == 0) {
    pOut._4_4_ = iPromote + 1;
    while ((pOut._4_4_ < pStruct->nLevel &&
           (pFVar4 = pStruct->aLevel + pOut._4_4_, pFVar4->nMerge == 0))) {
      pOut._0_4_ = pFVar4->nSeg;
      while (pOut._0_4_ = (int)pOut + -1, -1 < (int)pOut) {
        iVar2 = fts5SegmentSize(pFVar4->aSeg + (int)pOut);
        if (szPromote < iVar2) {
          return;
        }
        fts5StructureExtendLevel(&p->rc,pStruct,iPromote,1,1);
        if (p->rc != 0) {
          return;
        }
        pFVar1 = pFVar3->aSeg;
        pFVar5 = pFVar4->aSeg + (int)pOut;
        iVar2 = pFVar5->pgnoFirst;
        pFVar1->iSegid = pFVar5->iSegid;
        pFVar1->pgnoFirst = iVar2;
        pFVar1->pgnoLast = pFVar5->pgnoLast;
        pFVar3->nSeg = pFVar3->nSeg + 1;
        pFVar4->nSeg = pFVar4->nSeg + -1;
      }
      pOut._4_4_ = pOut._4_4_ + 1;
    }
  }
  return;
}

Assistant:

static void fts5StructurePromoteTo(
  Fts5Index *p,
  int iPromote,
  int szPromote,
  Fts5Structure *pStruct
){
  int il, is;
  Fts5StructureLevel *pOut = &pStruct->aLevel[iPromote];

  if( pOut->nMerge==0 ){
    for(il=iPromote+1; il<pStruct->nLevel; il++){
      Fts5StructureLevel *pLvl = &pStruct->aLevel[il];
      if( pLvl->nMerge ) return;
      for(is=pLvl->nSeg-1; is>=0; is--){
        int sz = fts5SegmentSize(&pLvl->aSeg[is]);
        if( sz>szPromote ) return;
        fts5StructureExtendLevel(&p->rc, pStruct, iPromote, 1, 1);
        if( p->rc ) return;
        memcpy(pOut->aSeg, &pLvl->aSeg[is], sizeof(Fts5StructureSegment));
        pOut->nSeg++;
        pLvl->nSeg--;
      }
    }
  }
}